

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O1

int test_loop(char *rom_filename,int num_log_lines,char *log_filename,uint32_t test_failed_address,
             int watch_reg)

{
  byte bVar1;
  uint32_t uVar2;
  uint uVar3;
  size_t sVar4;
  bool bVar5;
  cpu_log_t *pcVar6;
  ulong uVar7;
  undefined8 extraout_RAX;
  char *pcVar8;
  uint uVar9;
  char *pcVar10;
  char *pcVar11;
  uint32_t *puVar12;
  long lVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  uint uVar18;
  ulong auStack_70 [4];
  ulong local_50;
  cpu_log_t *local_48;
  uint32_t local_40;
  int local_3c;
  int local_38;
  uint32_t local_34;
  
  gba_log_verbosity = 4;
  auStack_70[2] = 0x106117;
  local_40 = test_failed_address;
  init_gbasystem(rom_filename,(char *)0x0,false);
  auStack_70[2] = 0x106126;
  skip_bios(cpu);
  uVar7 = (ulong)(uint)num_log_lines;
  local_48 = (cpu_log_t *)(auStack_70 + uVar7 * -10 + 3);
  auStack_70[uVar7 * -10 + 2] = 0x106149;
  load_log(log_filename,num_log_lines,(cpu_log_t *)(auStack_70 + uVar7 * -10 + 3));
  if (1 < gba_log_verbosity) {
    sVar4 = mem->rom_size;
    auStack_70[uVar7 * -10 + 2] = 0x10616a;
    printf("\x1b[0;36m[INFO]  ROM loaded: %lu bytes\n\x1b[0;m",sVar4);
  }
  if (1 < gba_log_verbosity) {
    auStack_70[uVar7 * -10 + 2] = 0x106184;
    printf("\x1b[0;36m[INFO]  Beginning CPU loop\n\x1b[0;m");
  }
  local_50 = (ulong)(uint)watch_reg;
  local_34 = 0;
  uVar18 = 0;
  local_3c = num_log_lines;
  local_38 = watch_reg;
  while( true ) {
    bVar1 = *(byte *)&cpu->cpsr;
    uVar2 = cpu->pc;
    if ((int)uVar18 < num_log_lines) break;
    if (watch_reg < 0) {
LAB_00106582:
      bVar5 = false;
    }
    else {
LAB_001064fa:
      auStack_70[uVar7 * -10 + 2] = 0x106509;
      local_34 = arm7tdmi_step(cpu);
      if (((int)uVar18 < num_log_lines) && (local_48[(int)uVar18].instruction != cpu->instr))
      goto LAB_00106630;
      uVar18 = uVar18 + 1;
      bVar5 = true;
      if ((0 < watch_reg) && (((uint)(bVar1 >> 5) * 2 | 0xfffffffc) + uVar2 == local_40)) {
        if (cpu->r[local_50] != 0) goto LAB_00106638;
        if (gba_log_verbosity < 2) goto LAB_00106582;
        bVar5 = false;
        auStack_70[uVar7 * -10 + 2] = 0x106580;
        printf("\x1b[0;36m[INFO]  Passed all tests!\n\x1b[0;m");
      }
    }
    if (!bVar5) {
      return 0;
    }
  }
  if (2 < gba_log_verbosity) {
    auStack_70[uVar7 * -10 + 2] = 0x1061ec;
    printf("[DEBUG] Checking registers against step %d (line %d in log)\n",(ulong)uVar18,
           (ulong)(uVar18 + 1));
  }
  pcVar6 = local_48;
  if (local_48[(int)uVar18].address == (cpu->pc + (((cpu->cpsr).raw & 0x20) >> 4)) - 4) {
    uVar3 = local_48[(int)uVar18].cpsr.raw;
    if (uVar3 != (cpu->cpsr).raw) {
      auStack_70[uVar7 * -10 + 2] = 0x106247;
      printf("Expected cpsr: ");
      pcVar11 = "N";
      if (-1 < (int)uVar3) {
        pcVar11 = "-";
      }
      pcVar10 = "Z";
      if ((uVar3 >> 0x1e & 1) == 0) {
        pcVar10 = "-";
      }
      pcVar8 = "C";
      if ((uVar3 >> 0x1d & 1) == 0) {
        pcVar8 = "-";
      }
      pcVar14 = "V";
      if ((uVar3 >> 0x1c & 1) == 0) {
        pcVar14 = "-";
      }
      pcVar15 = "I";
      if (-1 < (char)uVar3) {
        pcVar15 = "-";
      }
      pcVar16 = "F";
      if ((uVar3 & 0x40) == 0) {
        pcVar16 = "-";
      }
      pcVar17 = "T";
      if ((uVar3 & 0x20) == 0) {
        pcVar17 = "-";
      }
      auStack_70[uVar7 * -10 + 2] = (ulong)pcVar17;
      auStack_70[uVar7 * -10 + 1] = (ulong)pcVar16;
      auStack_70[uVar7 * -10] = 0x1062ca;
      printf("[%s%s%s%s%s%s%s]",pcVar11,pcVar10,pcVar8,pcVar14,pcVar15);
      auStack_70[uVar7 * -10 + 2] = 0x1062dc;
      printf(" Actual cpsr: ");
      uVar9 = (cpu->cpsr).raw;
      pcVar11 = "N";
      if (-1 < (int)uVar9) {
        pcVar11 = "-";
      }
      pcVar10 = "Z";
      if ((uVar9 >> 0x1e & 1) == 0) {
        pcVar10 = "-";
      }
      pcVar8 = "C";
      if ((uVar9 >> 0x1d & 1) == 0) {
        pcVar8 = "-";
      }
      pcVar14 = "V";
      if ((uVar9 >> 0x1c & 1) == 0) {
        pcVar14 = "-";
      }
      pcVar15 = "I";
      if (-1 < (char)uVar9) {
        pcVar15 = "-";
      }
      pcVar16 = "F";
      if ((uVar9 & 0x40) == 0) {
        pcVar16 = "-";
      }
      pcVar17 = "T";
      if ((uVar9 & 0x20) == 0) {
        pcVar17 = "-";
      }
      auStack_70[uVar7 * -10 + 2] = (ulong)pcVar17;
      auStack_70[uVar7 * -10 + 1] = (ulong)pcVar16;
      auStack_70[uVar7 * -10] = 0x10635f;
      printf("[%s%s%s%s%s%s%s]",pcVar11,pcVar10,pcVar8,pcVar14,pcVar15);
      auStack_70[uVar7 * -10 + 2] = 0x10636d;
      putchar(10);
    }
    watch_reg = local_38;
    num_log_lines = local_3c;
    if (pcVar6[(int)uVar18].r[0] == cpu->r[0]) {
      if (pcVar6[(int)uVar18].r[1] == cpu->r[1]) {
        if (pcVar6[(int)uVar18].r[2] != cpu->r[2]) {
LAB_001065d8:
          auStack_70[uVar7 * -10 + 2] = 0x1065e0;
          test_loop_cold_4();
          goto LAB_001065e0;
        }
        if (pcVar6[(int)uVar18].r[3] == cpu->r[3]) {
          if (pcVar6[(int)uVar18].r[4] != cpu->r[4]) {
LAB_001065d0:
            auStack_70[uVar7 * -10 + 2] = 0x1065d8;
            test_loop_cold_6();
            goto LAB_001065d8;
          }
          if (pcVar6[(int)uVar18].r[5] == cpu->r[5]) {
            if (pcVar6[(int)uVar18].r[6] != cpu->r[6]) {
LAB_001065c8:
              auStack_70[uVar7 * -10 + 2] = 0x1065d0;
              test_loop_cold_8();
              goto LAB_001065d0;
            }
            if (pcVar6[(int)uVar18].r[7] == cpu->r[7]) {
              uVar9 = (cpu->cpsr).raw & 0x1f;
              puVar12 = cpu->r + 8;
              if (uVar9 == 0x11) {
                puVar12 = cpu->highreg_fiq;
              }
              if (pcVar6[(int)uVar18].r[8] != *puVar12) {
LAB_001065c0:
                auStack_70[uVar7 * -10 + 2] = 0x1065c8;
                test_loop_cold_10();
                goto LAB_001065c8;
              }
              puVar12 = cpu->r + 9;
              if (uVar9 == 0x11) {
                puVar12 = cpu->highreg_fiq + 1;
              }
              if (pcVar6[(int)uVar18].r[9] == *puVar12) {
                puVar12 = cpu->r + 10;
                if (uVar9 == 0x11) {
                  puVar12 = cpu->highreg_fiq + 2;
                }
                if (pcVar6[(int)uVar18].r[10] != *puVar12) {
LAB_001065b8:
                  auStack_70[uVar7 * -10 + 2] = 0x1065c0;
                  test_loop_cold_12();
                  goto LAB_001065c0;
                }
                puVar12 = cpu->r + 0xb;
                if (uVar9 == 0x11) {
                  puVar12 = cpu->highreg_fiq + 3;
                }
                if (pcVar6[(int)uVar18].r[0xb] == *puVar12) {
                  puVar12 = cpu->r + 0xc;
                  if (uVar9 == 0x11) {
                    puVar12 = cpu->highreg_fiq + 4;
                  }
                  if (pcVar6[(int)uVar18].r[0xc] != *puVar12) {
LAB_001065b0:
                    auStack_70[uVar7 * -10 + 2] = 0x1065b8;
                    test_loop_cold_14();
                    goto LAB_001065b8;
                  }
                  uVar9 = uVar9 - 0x11;
                  lVar13 = 0x80;
                  if (uVar9 < 0xb) {
                    lVar13 = *(long *)(&DAT_00122780 + (ulong)uVar9 * 8);
                  }
                  if (pcVar6[(int)uVar18].r[0xd] == *(uint32_t *)((long)cpu->r + lVar13 + -0x38)) {
                    lVar13 = 0x98;
                    if (uVar9 < 0xb) {
                      lVar13 = *(long *)(&DAT_001227d8 + (ulong)uVar9 * 8);
                    }
                    if (pcVar6[(int)uVar18].r[0xe] != *(uint32_t *)((long)cpu->r + lVar13 + -0x38))
                    {
LAB_001065a8:
                      auStack_70[uVar7 * -10 + 2] = 0x1065b0;
                      test_loop_cold_16();
                      goto LAB_001065b0;
                    }
                    if (pcVar6[(int)uVar18].r[0xf] == cpu->pc) {
                      if (uVar3 == (cpu->cpsr).raw) {
                        if ((local_34 != pcVar6[(int)uVar18].cycles) && (gba_log_verbosity != 0)) {
                          auStack_70[uVar7 * -10 + 2] = 0x1064ef;
                          printf("\x1b[0;33m[WARN]  Cycles incorrect!\n\x1b[0;m");
                        }
                        goto LAB_001064fa;
                      }
                      auStack_70[uVar7 * -10 + 2] = 0x1065a8;
                      test_loop_cold_18();
                      goto LAB_001065a8;
                    }
                    goto LAB_001065e8;
                  }
                  goto LAB_001065f0;
                }
                goto LAB_001065f8;
              }
              goto LAB_00106600;
            }
            goto LAB_00106608;
          }
          goto LAB_00106610;
        }
        goto LAB_00106618;
      }
    }
    else {
LAB_001065e0:
      auStack_70[uVar7 * -10 + 2] = 0x1065e8;
      test_loop_cold_2();
LAB_001065e8:
      auStack_70[uVar7 * -10 + 2] = 0x1065f0;
      test_loop_cold_17();
LAB_001065f0:
      auStack_70[uVar7 * -10 + 2] = 0x1065f8;
      test_loop_cold_15();
LAB_001065f8:
      auStack_70[uVar7 * -10 + 2] = 0x106600;
      test_loop_cold_13();
LAB_00106600:
      auStack_70[uVar7 * -10 + 2] = 0x106608;
      test_loop_cold_11();
LAB_00106608:
      auStack_70[uVar7 * -10 + 2] = 0x106610;
      test_loop_cold_9();
LAB_00106610:
      auStack_70[uVar7 * -10 + 2] = 0x106618;
      test_loop_cold_7();
LAB_00106618:
      auStack_70[uVar7 * -10 + 2] = 0x106620;
      test_loop_cold_5();
    }
    auStack_70[uVar7 * -10 + 2] = 0x106628;
    test_loop_cold_3();
  }
  auStack_70[uVar7 * -10 + 2] = 0x106630;
  test_loop_cold_1();
LAB_00106630:
  auStack_70[uVar7 * -10 + 2] = 0x106638;
  test_loop_cold_19();
LAB_00106638:
  auStack_70[uVar7 * -10 + 2] = (ulong)main;
  test_loop_cold_20();
  auStack_70[uVar7 * -10 + 2] = extraout_RAX;
  auStack_70[uVar7 * -10 + 1] = 0x106661;
  test_loop("arm.gba",0x453,"arm.log",0x8001b94,0xc);
  auStack_70[uVar7 * -10 + 1] = (ulong)fill_pipe;
  exit(0);
}

Assistant:

int test_loop(const char* rom_filename, int num_log_lines, const char* log_filename, word test_failed_address, int watch_reg) {
    log_set_verbosity(4);
    init_gbasystem(rom_filename, NULL, false);

    skip_bios(cpu);

    cpu_log_t lines[num_log_lines];

    load_log(log_filename, num_log_lines, lines);

    loginfo("ROM loaded: %lu bytes", mem->rom_size)
    loginfo("Beginning CPU loop")
    int step = 0;
    int cycles = 0;

    while(true) {
        word adjusted_pc = cpu->pc - (cpu->cpsr.thumb ? 2 : 4);
        if (step >= num_log_lines) {
            if (watch_reg < 0) {
                return 0; // We win!
            }
        } else {
            // Register values in the log are BEFORE EXECUTING the instruction on that line
            logdebug("Checking registers against step %d (line %d in log)", step, step + 1)
            ASSERT_EQUAL(adjusted_pc, "Address", lines[step].address, cpu->pc - (cpu->cpsr.thumb ? 2 : 4))

            if (lines[step].cpsr.raw != cpu->cpsr.raw) {
                printf("Expected cpsr: ");
                printcpsr(lines[step].cpsr);
                printf(" Actual cpsr: ");
                printcpsr(cpu->cpsr);
                printf("\n");
            }

            ASSERT_EQUAL(adjusted_pc, "r0", lines[step].r[0], get_register(cpu, 0))
            ASSERT_EQUAL(adjusted_pc, "r1", lines[step].r[1], get_register(cpu, 1))
            ASSERT_EQUAL(adjusted_pc, "r2", lines[step].r[2], get_register(cpu, 2))
            ASSERT_EQUAL(adjusted_pc, "r3", lines[step].r[3], get_register(cpu, 3))
            ASSERT_EQUAL(adjusted_pc, "r4", lines[step].r[4], get_register(cpu, 4))
            ASSERT_EQUAL(adjusted_pc, "r5", lines[step].r[5], get_register(cpu, 5))
            ASSERT_EQUAL(adjusted_pc, "r6", lines[step].r[6], get_register(cpu, 6))
            ASSERT_EQUAL(adjusted_pc, "r7", lines[step].r[7], get_register(cpu, 7))
            ASSERT_EQUAL(adjusted_pc, "r8", lines[step].r[8], get_register(cpu, 8))
            ASSERT_EQUAL(adjusted_pc, "r9", lines[step].r[9], get_register(cpu, 9))
            ASSERT_EQUAL(adjusted_pc, "r10", lines[step].r[10], get_register(cpu, 10))
            ASSERT_EQUAL(adjusted_pc, "r11", lines[step].r[11], get_register(cpu, 11))
            ASSERT_EQUAL(adjusted_pc, "r12", lines[step].r[12], get_register(cpu, 12))
            ASSERT_EQUAL(adjusted_pc, "r13 (SP)", lines[step].r[13], get_register(cpu, 13))
            ASSERT_EQUAL(adjusted_pc, "r14 (LR)", lines[step].r[14], get_register(cpu, 14))
            ASSERT_EQUAL(adjusted_pc, "r15 (PC)", lines[step].r[15], get_register(cpu, 15))
            ASSERT_EQUAL(adjusted_pc, "CPSR", lines[step].cpsr.raw, cpu->cpsr.raw)

            //ASSERT_EQUAL(adjusted_pc, "cycles", lines[step].cycles, cycles)
            if (cycles != lines[step].cycles) {
                logwarn("Cycles incorrect!")
            }
        }

        cycles = arm7tdmi_step(cpu);
        if (step < num_log_lines) {
            ASSERT_EQUAL(adjusted_pc, "instruction", lines[step].instruction, cpu->instr)
        }
        step++;

        if (adjusted_pc == test_failed_address && watch_reg > 0) {
            word failed_test = cpu->r[watch_reg];
            if (failed_test > 0) {
                logfatal("FAILED TEST: %d", failed_test)
            } else {
                loginfo("Passed all tests!")
                return 0;
            }
        }
    }
}